

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dijkstra.cpp
# Opt level: O2

void __thiscall Dijkstra::run(Dijkstra *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  pointer ptVar4;
  pointer pvVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  ostream *poVar9;
  pointer piVar10;
  uint uVar11;
  priority_queue<Dijkstra::tuple,_std::vector<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>,_Dijkstra::Priority>
  *this_00;
  size_type __n;
  reference rVar12;
  allocator_type local_c9;
  uint local_c8;
  uint local_c4;
  vector<int,_std::allocator<int>_> *local_c0;
  int local_b4;
  size_type local_b0;
  int local_a8;
  int local_a4;
  vector<int,_std::allocator<int>_> *local_a0;
  priority_queue<Dijkstra::tuple,_std::vector<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>,_Dijkstra::Priority>
  *local_98;
  vector<bool,_std::allocator<bool>_> *local_90;
  long local_88;
  tuple initial;
  vector<bool,_std::allocator<bool>_> vis;
  
  vis.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  vis.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  vis.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._12_4_ = 0;
  vis.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  this_00 = &this->q;
  std::vector<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>::_M_move_assign(&this_00->c,&vis);
  std::_Vector_base<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>::~_Vector_base
            ((_Vector_base<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_> *)&vis);
  initial.node = initial.node & 0xffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&vis,(long)this->nb_nodes,(bool *)&initial,(allocator_type *)&local_c4);
  local_c4 = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&initial,(long)this->nb_nodes,
             (value_type_conflict1 *)&local_c4,&local_c9);
  local_a0 = &this->pred;
  std::vector<int,_std::allocator<int>_>::_M_move_assign(local_a0,&initial);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&initial);
  local_c4 = local_c4 & 0xffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&initial,(long)this->nb_nodes,(bool *)&local_c4,
             (allocator_type *)&local_c9);
  local_90 = &this->has_kids;
  std::vector<bool,_std::allocator<bool>_>::operator=
            (local_90,(vector<bool,_std::allocator<bool>_> *)&initial);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)&initial);
  local_c4 = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&initial,(long)this->nb_nodes,
             (value_type_conflict1 *)&local_c4,&local_c9);
  local_c0 = &this->cost;
  std::vector<int,_std::allocator<int>_>::_M_move_assign(local_c0,&initial);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&initial);
  (this->pred).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[this->source] = this->source;
  iVar7 = (*this->_vptr_Dijkstra[9])(this);
  piVar10 = (this->cost).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar10[this->source] = iVar7;
  initial.node = this->source;
  initial.cost = piVar10[initial.node];
  std::
  priority_queue<Dijkstra::tuple,_std::vector<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>,_Dijkstra::Priority>
  ::push(this_00,&initial);
  if (this->verbose == true) {
    poVar9 = std::operator<<((ostream *)&std::cout,"START");
    std::operator<<(poVar9,'\n');
  }
  local_b4 = 0;
  do {
    do {
      ptVar4 = (this->q).c.super__Vector_base<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ptVar4 == (this->q).c.
                     super__Vector_base<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>._M_impl.
                     super__Vector_impl_data._M_finish) || (this->nb_nodes <= local_b4)) {
        std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                  (&vis.super__Bvector_base<std::allocator<bool>_>);
        return;
      }
      uVar1 = ptVar4->node;
      std::
      priority_queue<Dijkstra::tuple,_std::vector<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>,_Dijkstra::Priority>
      ::pop(this_00);
      __n = (size_type)(int)uVar1;
      rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](&vis,__n);
    } while ((*rVar12._M_p & rVar12._M_mask) != 0);
    (*this->_vptr_Dijkstra[3])(this,(ulong)uVar1);
    rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](&vis,__n);
    *rVar12._M_p = *rVar12._M_p | rVar12._M_mask;
    if (this->verbose != false) {
      poVar9 = std::operator<<((ostream *)&std::cout,"Visiting ");
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,uVar1);
      poVar9 = std::operator<<(poVar9," from ");
      poVar9 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar9,
                          (local_a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[__n]);
      poVar9 = std::operator<<(poVar9,"(cost: ");
      poVar9 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar9,
                          (local_c0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[__n]);
      poVar9 = std::operator<<(poVar9,")");
      std::operator<<(poVar9,'\n');
    }
    local_b4 = local_b4 + 1;
    uVar11 = 0;
    local_88 = __n * 0x18;
    local_98 = this_00;
    while( true ) {
      pvVar5 = (this->out).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = *(long *)((long)&(pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + local_88);
      this_00 = local_98;
      if ((ulong)(*(long *)((long)&(pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish + local_88) - lVar6 >> 2) <=
          (ulong)uVar11) break;
      uVar2 = *(uint *)(lVar6 + (ulong)uVar11 * 4);
      iVar7 = (*this->_vptr_Dijkstra[4])(this,(ulong)uVar2);
      if (((char)iVar7 == '\0') &&
         (iVar7 = (*this->_vptr_Dijkstra[8])(this,(ulong)uVar2,0xffffffffffffffff), -1 < iVar7)) {
        local_c8 = *(uint *)(*(long *)&(this->en).
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[(int)uVar2].
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data + 4);
        iVar7 = (*this->_vptr_Dijkstra[6])(this);
        if ((char)iVar7 == '\0') {
          local_b0 = (size_type)(int)local_c8;
          rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](&vis,local_b0);
          if ((*rVar12._M_p & rVar12._M_mask) == 0) {
            piVar10 = (local_c0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            if (piVar10[local_b0] != -1) {
              local_a8 = piVar10[__n];
              local_a4 = piVar10[local_b0];
              iVar7 = (*this->_vptr_Dijkstra[8])(this,(ulong)uVar2);
              iVar8 = (*this->_vptr_Dijkstra[9])(this,(ulong)local_c8);
              if (local_a4 <= iVar7 + local_a8 + iVar8) goto LAB_0019f6a3;
              piVar10 = (local_c0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
            }
            uVar3 = piVar10[__n];
            iVar7 = (*this->_vptr_Dijkstra[8])(this,(ulong)uVar2,(ulong)uVar3);
            iVar8 = (*this->_vptr_Dijkstra[9])(this,(ulong)local_c8);
            (local_c0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[local_b0] = iVar7 + uVar3 + iVar8;
            (local_a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[local_b0] = uVar1;
            rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](local_90,__n);
            *rVar12._M_p = *rVar12._M_p | rVar12._M_mask;
            if (this->verbose == true) {
              poVar9 = std::operator<<((ostream *)&std::cout,"Marked ");
              poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,local_c8);
              poVar9 = std::operator<<(poVar9," from ");
              poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,uVar1);
              poVar9 = std::operator<<(poVar9," of cost ");
              poVar9 = (ostream *)
                       std::ostream::operator<<
                                 ((ostream *)poVar9,
                                  (local_c0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_start[local_b0]);
              std::operator<<(poVar9,'\n');
            }
            (*this->_vptr_Dijkstra[7])
                      (this,CONCAT44((this->cost).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start[local_b0],local_c8));
          }
        }
      }
      else {
        if (this->verbose == true) {
          poVar9 = std::operator<<((ostream *)&std::cout,"Ignoring edge ");
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,uVar2);
          poVar9 = std::operator<<(poVar9," from ");
          poVar9 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)poVar9,
                              *(this->en).
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[(int)uVar2].
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start);
          poVar9 = std::operator<<(poVar9," to ");
          poVar9 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)poVar9,
                              *(int *)(*(long *)&(this->en).
                                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start
                                                 [(int)uVar2].
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data + 4));
          std::operator<<(poVar9,'\n');
        }
        (*this->_vptr_Dijkstra[5])(this,(ulong)uVar2);
      }
LAB_0019f6a3:
      uVar11 = uVar11 + 1;
    }
  } while( true );
}

Assistant:

void Dijkstra::run() {
	q = std::priority_queue<tuple, std::vector<tuple>, Dijkstra::Priority>();
	std::vector<bool> vis = std::vector<bool>(nb_nodes, false);

	int count = 0;

	pred = std::vector<int>(nb_nodes, -1);
	has_kids = std::vector<bool>(nb_nodes, false);
	cost = std::vector<int>(nb_nodes, -1);

	pred[source] = source;
	cost[source] = duration(source);
	const tuple initial(source, cost[source]);
	q.push(initial);

	if (verbose) {
		std::cout << "START" << '\n';
	}

	while (!q.empty() && count < nb_nodes) {
		const tuple top = q.top();
		q.pop();
		const int curr = top.node;

		if (vis[curr]) {
			continue;
		}

		on_visiting_node(curr);
		vis[curr] = true;
		count++;

		if (verbose) {
			std::cout << "Visiting " << curr << " from " << pred[curr] << "(cost: " << cost[curr] << ")"
								<< '\n';
		}

		for (unsigned int i = 0; i < out[curr].size(); i++) {
			const int e = out[curr][i];
			assert(en[e][0] == curr);
			if (ignore_edge(e) || weight(e) < 0) {
				if (verbose) {
					std::cout << "Ignoring edge " << e << " from " << en[e][0] << " to " << en[e][1] << '\n';
				}
				on_ignore_edge(e);
				continue;
			}
			const int other = en[e][1];  // Head of e

			if (ignore_node(other)) {
				continue;
			}
			if (vis[other]) {
				continue;
			}

			if (cost[other] == -1 || cost[other] > cost[curr] + weight(e, cost[curr]) + duration(other)) {
				cost[other] = cost[curr] + weight(e, cost[curr]) + duration(other);
				assert(cost[other] != -1);
				pred[other] = curr;
				has_kids[curr] = true;
				if (verbose) {
					std::cout << "Marked " << other << " from " << curr << " of cost " << cost[other] << '\n';
				}
				const tuple new_node(other, cost[other]);
				enqueue(new_node);
			}
		}
	}
}